

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

type unodb::qsbr_state::inc_epoch_reset_previous(type word)

{
  bool bVar1;
  undefined8 in_RAX;
  uint uVar2;
  byte bVar3;
  undefined8 local_38;
  
  uVar2 = (uint)(word >> 0x20);
  if ((uVar2 & 0x3fffffff) < ((uint)word & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if ((word & 0x3fffffff) != 0) {
    __assert_fail("get_threads_in_previous_epoch(word) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x157,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  bVar3 = (byte)(word >> 0x3e) + 1;
  local_38 = CONCAT17(bVar3,(int7)CONCAT44(local_38._4_4_,uVar2)) & 0x3ffffff3fffffff;
  bVar1 = detail::qsbr_epoch::operator==
                    ((qsbr_epoch *)((long)&local_38 + 7),(qsbr_epoch)(bVar3 & 3));
  if (!bVar1) {
    __assert_fail("get_epoch(result) == old_epoch.advance()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x161,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  if ((uVar2 & 0x3fffffff) != (uint)local_38) {
    __assert_fail("get_thread_count(result) == get_thread_count(word)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x162,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  return (ulong)(uVar2 & 0x3fffffff) | word & 0x3fffffff00000000 | (ulong)bVar3 << 0x3e;
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_epoch_reset_previous(
      type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 0);

    const auto old_epoch = get_epoch(word);
    const auto new_epoch_in_word = make_from_epoch(old_epoch.advance());
    const auto new_thread_count_in_word = word & thread_count_in_word_mask;
    const auto new_threads_in_previous = (word >> thread_count_in_word_offset) &
                                         threads_in_previous_epoch_in_word_mask;
    const auto result =
        new_epoch_in_word | new_thread_count_in_word | new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(result) == old_epoch.advance());
    UNODB_DETAIL_ASSERT(get_thread_count(result) == get_thread_count(word));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }